

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O0

BOOL __thiscall HashTbl::Init(HashTbl *this,uint cidHash)

{
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  undefined4 *puVar4;
  Ident **ppIVar5;
  char *name;
  DictionaryStats *pDVar6;
  uint local_24;
  uint local_20;
  uint cbTemp;
  int32 cb;
  uint cidHash_local;
  HashTbl *this_local;
  
  cbTemp = cidHash;
  _cb = this;
  if ((cidHash == 0) || ((cidHash & cidHash - 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x20,"(cidHash > 0 && 0 == (cidHash & (cidHash - 1)))",
                       "cidHash > 0 && 0 == (cidHash & (cidHash - 1))");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this->m_luMask = cbTemp - 1;
  this->m_luCount = 0;
  HVar3 = UIntMult(cbTemp,8,&local_24);
  if ((HVar3 < 0) || (0x7fffffff < local_24)) {
    this_local._4_4_ = 0;
  }
  else {
    local_20 = local_24;
    ppIVar5 = (Ident **)NoReleaseAllocator::Alloc(&this->m_noReleaseAllocator,local_24);
    this->m_prgpidName = ppIVar5;
    if (ppIVar5 == (Ident **)0x0) {
      this_local._4_4_ = 0;
    }
    else {
      memset(this->m_prgpidName,0,(long)(int)local_20);
      name = std::type_info::name((type_info *)&HashTbl*::typeinfo);
      pDVar6 = DictionaryStats::Create(name,cbTemp);
      this->stats = pDVar6;
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL HashTbl::Init(uint cidHash)
{
    // cidHash must be a power of two
    Assert(cidHash > 0 && 0 == (cidHash & (cidHash - 1)));

    int32 cb;

    /* Allocate and clear the hash bucket table */
    m_luMask = cidHash - 1;
    m_luCount = 0;

    // (Bug 1117873 - Windows OS Bugs)
    // Prefast: Verify that cidHash * sizeof(Ident *) does not cause an integer overflow
    // NoReleaseAllocator( ) takes int32 - so check for LONG_MAX
    // Win8 730594 - Use intsafe function to check for overflow.
    uint cbTemp;
    if (FAILED(UIntMult(cidHash, sizeof(Ident *), &cbTemp)) || cbTemp > LONG_MAX)
        return FALSE;

    cb = cbTemp;
    if (nullptr == (m_prgpidName = (Ident **)m_noReleaseAllocator.Alloc(cb)))
        return FALSE;
    memset(m_prgpidName, 0, cb);

#if PROFILE_DICTIONARY
    stats = DictionaryStats::Create(typeid(this).name(), cidHash);
#endif

    return TRUE;
}